

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printSomething.cpp
# Opt level: O2

void print_tool(MatchTool *tool,ostream *os)

{
  pointer pvVar1;
  long lVar2;
  pointer piVar3;
  ostream *poVar4;
  int i;
  ulong uVar5;
  int i_1;
  int j;
  ulong uVar6;
  
  poVar4 = std::operator<<(os,"{");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (uVar5 = 0;
      uVar5 < (ulong)(((long)(tool->dtran).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(tool->dtran).
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar5 = uVar5 + 1) {
    std::operator<<(os,"\t{");
    for (uVar6 = 0;
        pvVar1 = (tool->dtran).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar2 = *(long *)&pvVar1[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl,
        uVar6 < (ulong)((long)*(pointer *)
                               ((long)&pvVar1[uVar5].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl + 8) - lVar2 >> 2); uVar6 = uVar6 + 1) {
      std::ostream::operator<<((ostream *)os,*(int *)(lVar2 + uVar6 * 4));
      pvVar1 = (tool->dtran).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar6 != ((long)*(pointer *)
                           ((long)&pvVar1[uVar5].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl + 8) -
                    *(long *)&pvVar1[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl >>
                   2) - 1U) {
        std::operator<<(os,", ");
      }
    }
    poVar4 = std::operator<<(os,"}");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::operator<<(os,"}\n{");
  for (uVar5 = 0;
      piVar3 = (tool->targets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(tool->targets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar3 >> 2);
      uVar5 = uVar5 + 1) {
    std::ostream::operator<<((ostream *)os,piVar3[uVar5]);
    if (uVar5 != ((long)(tool->targets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(tool->targets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) - 1U) {
      std::operator<<(os,", ");
    }
  }
  poVar4 = std::operator<<(os,"}");
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void print_tool(const MatchTool& tool, std::ostream& os) {
    os << "{" << endl;
    for (int i = 0; i < tool.dtran.size(); i++) {
        os << "\t{";
        for (int j = 0; j < tool.dtran[i].size(); j++) {
            os << tool.dtran[i][j];
            if (j != tool.dtran[i].size() - 1)
                os << ", ";
        }
        os << "}" << endl;
    }
    os << "}\n{";
    for (int i = 0; i < tool.targets.size(); i++) {
        os << tool.targets[i];
        if (i != tool.targets.size() - 1)
            os << ", ";
    }
    os << "}" << endl;

}